

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void construct_children<std::pair<int,float>>
               (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *current_cell,
               directed_graph_t *graph,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
               int max_dimension,int current_dimension)

{
  vertex_index_t vertex;
  vertex_index_t *pvVar1;
  bool bVar2;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *current_cell_00;
  vertex_index_t *pvVar3;
  unsigned_short v;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  vertex_index_t local_6a;
  int local_68;
  int local_64;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_60;
  vertex_index_t *local_58;
  vertex_index_t *local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  if (current_dimension != max_dimension) {
    pvVar3 = (possible_next_vertices->
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_68 = current_dimension + 1;
    local_64 = max_dimension;
    local_60 = possible_next_vertices;
    local_58 = pvVar3;
    for (local_50 = (possible_next_vertices->
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                    super__Vector_impl_data._M_start; local_50 != pvVar3; local_50 = local_50 + 1) {
      vertex = *local_50;
      if (vertex != current_cell->vertex) {
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pvVar1 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pvVar3 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                      )._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1;
            pvVar3 = pvVar3 + 1) {
          local_6a = *pvVar3;
          if ((local_6a != vertex) && (local_6a != current_cell->vertex)) {
            bVar2 = directed_graph_t::is_connected_by_an_edge(graph,vertex,local_6a);
            if (bVar2) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
                         &local_6a);
            }
          }
        }
        current_cell_00 =
             directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::add_child
                       (current_cell,vertex);
        construct_children<std::pair<int,float>>
                  (current_cell_00,graph,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,local_64,
                   local_68);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        pvVar3 = local_58;
      }
    }
  }
  return;
}

Assistant:

void construct_children(directed_flag_complex_cell_in_memory_t<ExtraData>& current_cell, const directed_graph_t& graph,
                        const std::vector<vertex_index_t>& possible_next_vertices, int max_dimension,
                        int current_dimension = 0) {
	if (current_dimension == max_dimension) return;

	for (auto vertex : possible_next_vertices) {
		if (vertex == current_cell.vertex) continue;

		// Compute the next elements
		std::vector<vertex_index_t> new_possible_vertices;
		for (auto v : possible_next_vertices)
			if (v != vertex && v != current_cell.vertex && graph.is_connected_by_an_edge(vertex, v))
				new_possible_vertices.push_back(v);

		directed_flag_complex_cell_in_memory_t<ExtraData>& new_cell = current_cell.add_child(vertex);
		construct_children(new_cell, graph, new_possible_vertices, max_dimension, current_dimension + 1);
	}
}